

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O2

void __thiscall correctness_div_return_value_Test::TestBody(correctness_div_return_value_Test *this)

{
  big_integer *this_00;
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  AssertHelper local_90;
  AssertionResult gtest_ar;
  big_integer b;
  big_integer a;
  
  big_integer::big_integer(&a,100);
  big_integer::big_integer(&b,2);
  this_00 = big_integer::operator/=(&a,&b);
  big_integer::operator/=(this_00,&b);
  local_98.ptr_._0_4_ = 0x19;
  testing::internal::CmpHelperEQ<big_integer,int>
            ((internal *)&gtest_ar,"a","25",&a,(int *)&local_98);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_98);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/YaroslavZhurba[P]BigInt/big_integer_testing.cpp"
               ,0x112,message);
    testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_98);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  big_integer::~big_integer(&b);
  big_integer::~big_integer(&a);
  return;
}

Assistant:

TEST(correctness, div_return_value)
{
    big_integer a = 100;
    big_integer b = 2;

    (a /= b) /= b;
    EXPECT_EQ(a, 25);
}